

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_19cdc37::ResizeTest_TestExternalResizeWorks4Threads_Test::TestBody
          (ResizeTest_TestExternalResizeWorks4Threads_Test *this)

{
  EncoderTest *pEVar1;
  pointer pFVar2;
  undefined8 *puVar3;
  bool bVar4;
  pointer pFVar5;
  SEARCH_METHODS *pSVar6;
  AssertHelper local_a0;
  AssertHelper local_98;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  uint expected_h;
  uint expected_w;
  ResizingVideoSource video;
  
  ResizingVideoSource::ResizingVideoSource(&video,0x280,0x1e0);
  video.super_DummyVideoSource._44_4_ = 0;
  video.random_input_one_half_only_ = true;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_lag_in_frames = 0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.rc_dropframe_thresh = 0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_forced_max_frame_width = 0x280;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_forced_max_frame_height = 0x1e0;
  (this->super_ResizeTest).super_EncoderTest.cfg_.g_threads = 4;
  (this->super_ResizeTest).super_EncoderTest.cfg_.kf_min_dist = 0x28;
  (this->super_ResizeTest).super_EncoderTest.cfg_.kf_max_dist = 0x28;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      pEVar1 = &(this->super_ResizeTest).super_EncoderTest;
      (*pEVar1->_vptr_EncoderTest[2])(pEVar1,&video);
    }
    bVar4 = gtest_fatal_failure_checker.has_new_fatal_failure_;
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (bVar4 == false) {
      local_a0.data_ =
           (AssertHelperData *)
           ((long)(this->super_ResizeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->super_ResizeTest).frame_info_list_.
                  super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4);
      local_98.data_._0_4_ = video.super_DummyVideoSource.limit_;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
                ((internal *)&gtest_fatal_failure_checker,"frame_info_list_.size()","video.limit()",
                 (unsigned_long *)&local_a0,(uint *)&local_98);
      if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                _vptr_TestPartResultReporterInterface == '\0') {
        testing::Message::Message((Message *)&local_a0);
        if ((undefined8 *)
            CONCAT71(gtest_fatal_failure_checker._9_7_,
                     gtest_fatal_failure_checker.has_new_fatal_failure_) == (undefined8 *)0x0) {
          pSVar6 = "";
        }
        else {
          pSVar6 = *(SEARCH_METHODS **)
                    CONCAT71(gtest_fatal_failure_checker._9_7_,
                             gtest_fatal_failure_checker.has_new_fatal_failure_);
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_98,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                   ,0x14d,(char *)pSVar6);
        testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(&local_98);
        if (local_a0.data_ != (AssertHelperData *)0x0) {
          (**(code **)(*(long *)local_a0.data_ + 8))();
        }
        puVar3 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar3 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar3 != puVar3 + 2) {
            operator_delete((undefined8 *)*puVar3);
          }
          operator_delete(puVar3);
        }
      }
      else {
        puVar3 = (undefined8 *)
                 CONCAT71(gtest_fatal_failure_checker._9_7_,
                          gtest_fatal_failure_checker.has_new_fatal_failure_);
        if (puVar3 != (undefined8 *)0x0) {
          if ((undefined8 *)*puVar3 != puVar3 + 2) {
            operator_delete((undefined8 *)*puVar3);
          }
          operator_delete(puVar3);
        }
        pFVar5 = (this->super_ResizeTest).frame_info_list_.
                 super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pFVar2 = (this->super_ResizeTest).frame_info_list_.
                 super__Vector_base<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pFVar5 != pFVar2) {
          do {
            ScaleForFrameNumber((uint)pFVar5->pts,0x280,0x1e0,video.super_DummyVideoSource._44_4_,
                                false,video.random_input_one_half_only_,&expected_w,&expected_h);
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_fatal_failure_checker,"expected_w","info.w",&expected_w,
                       &pFVar5->w);
            if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface == '\0') {
              testing::Message::Message((Message *)&local_a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_a0.data_)->line,"Frame ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_a0.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_a0.data_)->line," had unexpected width",0x15);
              pSVar6 = "";
              if ((undefined8 *)
                  CONCAT71(gtest_fatal_failure_checker._9_7_,
                           gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0)
              {
                pSVar6 = *(SEARCH_METHODS **)
                          CONCAT71(gtest_fatal_failure_checker._9_7_,
                                   gtest_fatal_failure_checker.has_new_fatal_failure_);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x156,(char *)pSVar6);
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (local_a0.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_a0.data_ + 8))();
              }
            }
            puVar3 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar3 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar3 != puVar3 + 2) {
                operator_delete((undefined8 *)*puVar3);
              }
              operator_delete(puVar3);
            }
            testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                      ((internal *)&gtest_fatal_failure_checker,"expected_h","info.h",&expected_h,
                       &pFVar5->h);
            if ((char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                      _vptr_TestPartResultReporterInterface == '\0') {
              testing::Message::Message((Message *)&local_a0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_a0.data_)->line,"Frame ",6);
              std::ostream::_M_insert<unsigned_long>((ulong)&(local_a0.data_)->line);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&(local_a0.data_)->line," had unexpected height",0x16);
              pSVar6 = "";
              if ((undefined8 *)
                  CONCAT71(gtest_fatal_failure_checker._9_7_,
                           gtest_fatal_failure_checker.has_new_fatal_failure_) != (undefined8 *)0x0)
              {
                pSVar6 = *(SEARCH_METHODS **)
                          CONCAT71(gtest_fatal_failure_checker._9_7_,
                                   gtest_fatal_failure_checker.has_new_fatal_failure_);
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
                         ,0x158,(char *)pSVar6);
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_a0);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if (local_a0.data_ != (AssertHelperData *)0x0) {
                (**(code **)(*(long *)local_a0.data_ + 8))();
              }
            }
            puVar3 = (undefined8 *)
                     CONCAT71(gtest_fatal_failure_checker._9_7_,
                              gtest_fatal_failure_checker.has_new_fatal_failure_);
            if (puVar3 != (undefined8 *)0x0) {
              if ((undefined8 *)*puVar3 != puVar3 + 2) {
                operator_delete((undefined8 *)*puVar3);
              }
              operator_delete(puVar3);
            }
            pFVar5 = pFVar5 + 1;
          } while (pFVar5 != pFVar2);
        }
      }
      goto LAB_0066accb;
    }
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/resize_test.cc"
             ,0x149,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_a0,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  if ((long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                       _vptr_TestPartResultReporterInterface._1_7_,
                       (char)gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                             _vptr_TestPartResultReporterInterface) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT71(gtest_fatal_failure_checker.super_TestPartResultReporterInterface
                                   ._vptr_TestPartResultReporterInterface._1_7_,
                                   (char)gtest_fatal_failure_checker.
                                         super_TestPartResultReporterInterface.
                                         _vptr_TestPartResultReporterInterface) + 8))();
  }
LAB_0066accb:
  video.super_DummyVideoSource.super_VideoSource._vptr_VideoSource =
       (_func_int **)&PTR__DummyVideoSource_010306b0;
  aom_img_free(video.super_DummyVideoSource.img_);
  return;
}

Assistant:

TEST_P(ResizeTest, TestExternalResizeWorks4Threads) {
  ResizingVideoSource video(640, 480);
  video.flag_codec_ = 0;
  video.random_input_one_half_only_ = true;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_forced_max_frame_width = 640;
  cfg_.g_forced_max_frame_height = 480;
  cfg_.g_threads = 4;
  cfg_.kf_max_dist = 40;
  cfg_.kf_min_dist = 40;
  cfg_.rc_dropframe_thresh = 0;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  // Check we decoded the same number of frames as we attempted to encode
  ASSERT_EQ(frame_info_list_.size(), video.limit());

  for (const auto &info : frame_info_list_) {
    const unsigned int frame = static_cast<unsigned>(info.pts);
    unsigned int expected_w;
    unsigned int expected_h;
    ScaleForFrameNumber(frame, 640, 480, video.flag_codec_, false,
                        video.random_input_one_half_only_, &expected_w,
                        &expected_h);
    EXPECT_EQ(expected_w, info.w)
        << "Frame " << frame << " had unexpected width";
    EXPECT_EQ(expected_h, info.h)
        << "Frame " << frame << " had unexpected height";
  }
#endif
}